

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Query.cpp
# Opt level: O3

Query * q(QString *qstr)

{
  pointer pQVar1;
  Query *in_RDI;
  
  in_RDI->type = PRIMITIVE;
  pQVar1 = (qstr->super__Vector_base<QToken,_std::allocator<QToken>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  (in_RDI->value).super__Vector_base<QToken,_std::allocator<QToken>_>._M_impl.
  super__Vector_impl_data._M_start =
       (qstr->super__Vector_base<QToken,_std::allocator<QToken>_>)._M_impl.super__Vector_impl_data.
       _M_start;
  (in_RDI->value).super__Vector_base<QToken,_std::allocator<QToken>_>._M_impl.
  super__Vector_impl_data._M_finish = pQVar1;
  (in_RDI->value).super__Vector_base<QToken,_std::allocator<QToken>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (qstr->super__Vector_base<QToken,_std::allocator<QToken>_>)._M_impl.super__Vector_impl_data.
       _M_end_of_storage;
  (qstr->super__Vector_base<QToken,_std::allocator<QToken>_>)._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (qstr->super__Vector_base<QToken,_std::allocator<QToken>_>)._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (qstr->super__Vector_base<QToken,_std::allocator<QToken>_>)._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (in_RDI->ngram).itype = GRAM3;
  (in_RDI->ngram).trigram = 0;
  in_RDI->count = 0;
  (in_RDI->queries).super__Vector_base<Query,_std::allocator<Query>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (in_RDI->queries).super__Vector_base<Query,_std::allocator<Query>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (in_RDI->queries).super__Vector_base<Query,_std::allocator<Query>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  return in_RDI;
}

Assistant:

Query q(QString &&qstr) { return Query(std::move(qstr)); }